

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

Float __thiscall pbrt::Vertex::PDF(Vertex *this,Integrator *integrator,Vertex *prev,Vertex *next)

{
  undefined8 uVar1;
  VertexType VVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Float FVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Vector3f wiRender;
  Vector3f woRender;
  Float pdf;
  Float unused;
  Float local_9c;
  Tuple3<pbrt::Vector3,_float> local_98;
  Float local_8c;
  RayDifferential local_88;
  
  VVar2 = this->type;
  if (VVar2 == Light) {
    FVar7 = PDFLight(this,integrator,next);
    return FVar7;
  }
  uVar1 = *(undefined8 *)
           &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar9 = vinsertps_avx(*(undefined1 (*) [16])&next->field_2,
                         ZEXT416((uint)(next->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  auVar6 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                         ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  auVar13._0_4_ = ((float)uVar1 + auVar6._0_4_) * 0.5;
  auVar13._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar6._4_4_) * 0.5;
  auVar13._8_4_ = (auVar6._8_4_ + 0.0) * 0.5;
  auVar13._12_4_ = (auVar6._12_4_ + 0.0) * 0.5;
  fVar3 = ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
          (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
  uVar1 = *(undefined8 *)
           &(next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  fVar4 = ((next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
          (next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 - fVar3;
  auVar6._0_4_ = ((float)uVar1 + auVar9._0_4_) * 0.5;
  auVar6._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar9._4_4_) * 0.5;
  auVar6._8_4_ = (auVar9._8_4_ + 0.0) * 0.5;
  auVar6._12_4_ = (auVar9._12_4_ + 0.0) * 0.5;
  auVar6 = vsubps_avx(auVar6,auVar13);
  auVar9._0_4_ = auVar6._0_4_ * auVar6._0_4_;
  auVar9._4_4_ = auVar6._4_4_ * auVar6._4_4_;
  auVar9._8_4_ = auVar6._8_4_ * auVar6._8_4_;
  auVar9._12_4_ = auVar6._12_4_ * auVar6._12_4_;
  auVar9 = vhaddps_avx(auVar9,auVar9);
  fVar8 = fVar4 * fVar4 + auVar9._0_4_;
  if ((fVar8 == 0.0) && (!NAN(fVar8))) {
    return 0.0;
  }
  auVar9 = vsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
  fVar8 = auVar9._0_4_;
  auVar15._4_4_ = fVar8;
  auVar15._0_4_ = fVar8;
  auVar15._8_4_ = fVar8;
  auVar15._12_4_ = fVar8;
  auVar12._0_4_ = fVar4 / fVar8;
  auVar12._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar9 = vdivps_avx(auVar6,auVar15);
  local_98._0_8_ = vmovlps_avx(auVar9);
  local_98.z = auVar12._0_4_;
  if (prev == (Vertex *)0x0) {
    if (VVar2 != Camera) {
      LogFatal<char_const(&)[27]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                 ,0x6db,"Check failed: %s",(char (*) [27])"type == VertexType::Camera");
    }
  }
  else {
    uVar1 = *(undefined8 *)
             &(prev->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    auVar6 = vinsertps_avx(ZEXT416((uint)(prev->field_2).ei.super_Interaction.pi.
                                         super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low),
                           ZEXT416((uint)(prev->field_2).ei.super_Interaction.pi.
                                         super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
    auVar16._0_4_ = (float)uVar1 + auVar6._0_4_;
    auVar16._4_4_ = (float)((ulong)uVar1 >> 0x20) + auVar6._4_4_;
    auVar16._8_4_ = auVar6._8_4_ + 0.0;
    auVar16._12_4_ = auVar6._12_4_ + 0.0;
    auVar5._8_4_ = 0x3f000000;
    auVar5._0_8_ = 0x3f0000003f000000;
    auVar5._12_4_ = 0x3f000000;
    auVar6 = vmulps_avx512vl(auVar16,auVar5);
    fVar3 = ((prev->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
            (prev->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 - fVar3;
    auVar13 = vsubps_avx(auVar6,auVar13);
    auVar17._0_4_ = auVar13._0_4_ * auVar13._0_4_;
    auVar17._4_4_ = auVar13._4_4_ * auVar13._4_4_;
    auVar17._8_4_ = auVar13._8_4_ * auVar13._8_4_;
    auVar17._12_4_ = auVar13._12_4_ * auVar13._12_4_;
    auVar6 = vhaddps_avx(auVar17,auVar17);
    fVar8 = auVar6._0_4_ + fVar3 * fVar3;
    if ((fVar8 == 0.0) && (!NAN(fVar8))) {
      return 0.0;
    }
    auVar6 = vsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
    local_9c = 0.0;
    fVar8 = auVar6._0_4_;
    auVar10._4_4_ = fVar8;
    auVar10._0_4_ = fVar8;
    auVar10._8_4_ = fVar8;
    auVar10._12_4_ = fVar8;
    auVar11._0_4_ = fVar3 / fVar8;
    auVar11._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar6 = vdivps_avx(auVar13,auVar10);
    if (VVar2 == Medium) {
      auVar14._0_4_ = auVar9._0_4_ * auVar6._0_4_;
      auVar14._4_4_ = auVar9._4_4_ * auVar6._4_4_;
      auVar14._8_4_ = auVar9._8_4_ * auVar6._8_4_;
      auVar14._12_4_ = auVar9._12_4_ * auVar6._12_4_;
      auVar13 = vmovshdup_avx(auVar14);
      auVar9 = vfmadd231ss_fma(auVar13,auVar6,auVar9);
      fVar8 = *(float *)((ulong)(this->field_2).ei.field_0 & 0xffffffffffff);
      auVar9 = vfmadd213ss_fma(auVar12,auVar11,auVar9);
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),
                               SUB6416(ZEXT464(0x3f800000),0));
      auVar13 = vfnmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),
                                 SUB6416(ZEXT464(0x3f800000),0));
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)(fVar8 + fVar8)),auVar9,auVar6);
      auVar9 = vmaxss_avx(auVar6,ZEXT816(0));
      auVar9 = vsqrtss_avx(auVar9,auVar9);
      local_9c = (auVar13._0_4_ * 0.07957747) / (auVar6._0_4_ * auVar9._0_4_);
      goto LAB_003e58d2;
    }
    if (VVar2 == Surface) {
      wiRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar9._0_8_;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = auVar12._0_4_;
      woRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar6._0_8_;
      woRender.super_Tuple3<pbrt::Vector3,_float>.z = auVar11._0_4_;
      local_9c = BSDF::PDF(&this->bsdf,woRender,wiRender,Radiance,All);
      goto LAB_003e58d2;
    }
    if (VVar2 != Camera) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
               ,0x6e6,"Vertex::PDF(): Unimplemented");
    }
  }
  local_9c = 0.0;
  Interaction::SpawnRay(&local_88,&(this->field_2).ei.super_Interaction,(Vector3f *)&local_98);
  CameraHandle::PDF_We
            ((CameraHandle *)&(this->field_2).mi.phase,&local_88.super_Ray,&local_8c,&local_9c);
LAB_003e58d2:
  FVar7 = ConvertDensity(this,local_9c,next);
  return FVar7;
}

Assistant:

Float PDF(const Integrator &integrator, const Vertex *prev,
              const Vertex &next) const {
        if (type == VertexType::Light)
            return PDFLight(integrator, next);
        // Compute directions to preceding and next vertex
        Vector3f wn = next.p() - p();
        if (LengthSquared(wn) == 0)
            return 0;
        wn = Normalize(wn);
        Vector3f wp;
        if (prev) {
            wp = prev->p() - p();
            if (LengthSquared(wp) == 0)
                return 0;
            wp = Normalize(wp);
        } else
            CHECK(type == VertexType::Camera);

        // Compute directional density depending on the vertex type
        Float pdf = 0, unused;
        if (type == VertexType::Camera)
            ei.camera.PDF_We(ei.SpawnRay(wn), &unused, &pdf);
        else if (type == VertexType::Surface)
            pdf = bsdf.PDF(wp, wn);
        else if (type == VertexType::Medium)
            pdf = mi.phase.p(wp, wn);
        else
            LOG_FATAL("Vertex::PDF(): Unimplemented");

        // Return probability per unit area at vertex _next_
        return ConvertDensity(pdf, next);
    }